

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O1

void Amap_ManCutSaveStored(Amap_Man_t *p,Amap_Obj_t *pNode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint *puVar5;
  Vec_Int_t *pVVar6;
  uint *puVar7;
  uint uVar8;
  long lVar9;
  Amap_Cut_t *pAVar10;
  int iVar11;
  uint uVar12;
  
  if ((pNode->field_11).pData != (void *)0x0) {
    __assert_fail("pNode->pData == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/amap/amapMerge.c"
                  ,0xb4,"void Amap_ManCutSaveStored(Amap_Man_t *, Amap_Obj_t *)");
  }
  iVar3 = p->pPars->nCutsMax;
  lVar4 = (long)p->vTemp->nSize;
  uVar12 = 1;
  if (lVar4 < 1) {
    iVar11 = 2;
    uVar8 = 1;
  }
  else {
    iVar11 = 2;
    uVar8 = 1;
    lVar9 = 0;
    do {
      for (pAVar10 = p->ppCutsTemp[p->vTemp->pArray[lVar9]]; pAVar10 != (Amap_Cut_t *)0x0;
          pAVar10 = *(Amap_Cut_t **)(pAVar10 + (ulong)((uint)*pAVar10 >> 0x11) + 1)) {
        uVar8 = uVar8 + 1;
        if ((int)uVar8 < iVar3) {
          iVar11 = iVar11 + ((uint)*pAVar10 >> 0x11) + 1;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar4);
  }
  p->nBytesUsed = p->nBytesUsed + iVar11 * 4;
  puVar5 = (uint *)Aig_MmFlexEntryFetch(p->pMemCuts,iVar11 * 4);
  *puVar5 = 0x20000;
  puVar5[1] = *(uint *)pNode >> 2 & 0xfffffffe;
  puVar7 = puVar5 + 2;
  pVVar6 = p->vTemp;
  if (0 < pVVar6->nSize) {
    uVar12 = 1;
    lVar4 = 0;
    do {
      iVar1 = pVVar6->pArray[lVar4];
      for (pAVar10 = p->ppCutsTemp[iVar1]; pAVar10 != (Amap_Cut_t *)0x0;
          pAVar10 = *(Amap_Cut_t **)(pAVar10 + (ulong)((uint)*pAVar10 >> 0x11) + 1)) {
        uVar12 = uVar12 + 1;
        if ((int)uVar12 < iVar3) {
          memcpy(puVar7,pAVar10,(ulong)((uint)*pAVar10 >> 0x11) * 4 + 4);
          puVar7 = puVar7 + (ulong)((uint)*pAVar10 >> 0x11) + 1;
        }
      }
      p->ppCutsTemp[iVar1] = (Amap_Cut_t *)0x0;
      lVar4 = lVar4 + 1;
      pVVar6 = p->vTemp;
    } while (lVar4 < pVVar6->nSize);
  }
  if (uVar8 != uVar12) {
    __assert_fail("nCuts == nCuts2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/amap/amapMerge.c"
                  ,0xda,"void Amap_ManCutSaveStored(Amap_Man_t *, Amap_Obj_t *)");
  }
  if ((long)puVar7 - (long)puVar5 >> 2 != (long)iVar11) {
    __assert_fail("(int *)pNext - pBuffer == nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/amap/amapMerge.c"
                  ,0xdb,"void Amap_ManCutSaveStored(Amap_Man_t *, Amap_Obj_t *)");
  }
  pVVar6->nSize = 0;
  Aig_MmFlexRestart(p->pMemTemp);
  if (0 < p->pLib->nNodes) {
    lVar4 = 0;
    do {
      if (p->ppCutsTemp[lVar4] != (Amap_Cut_t *)0x0) {
        puts("Amap_ManCutSaveStored(): Error!");
      }
      lVar4 = lVar4 + 1;
      lVar9 = (long)p->pLib->nNodes;
    } while (SBORROW8(lVar4,lVar9 * 2) != lVar4 + lVar9 * -2 < 0);
  }
  (pNode->field_11).pData = puVar5;
  uVar12 = iVar3 - 1;
  uVar2 = uVar12;
  if ((int)uVar8 < (int)uVar12) {
    uVar2 = uVar8;
  }
  pNode->nCuts = uVar2;
  if (0xfffff < (int)uVar8) {
    __assert_fail("nCuts < (1<<20)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/amap/amapMerge.c"
                  ,0xe4,"void Amap_ManCutSaveStored(Amap_Man_t *, Amap_Obj_t *)");
  }
  if (iVar3 != 0 && 0 < (int)uVar2) {
    uVar8 = uVar2 - 1;
    if (uVar12 < uVar2 - 1) {
      uVar8 = uVar12;
    }
    iVar3 = uVar8 + 1;
    puVar7 = (uint *)0x0;
    do {
      if ((puVar7 != (uint *)0x0) && ((ushort)*puVar5 < (ushort)*puVar7)) {
        __assert_fail("pCut == NULL || pCut->iMat <= pNext->iMat",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/amap/amapMerge.c"
                      ,0xee,"void Amap_ManCutSaveStored(Amap_Man_t *, Amap_Obj_t *)");
      }
      iVar3 = iVar3 + -1;
      puVar7 = puVar5;
      puVar5 = puVar5 + (ulong)(*puVar5 >> 0x11) + 1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

void Amap_ManCutSaveStored( Amap_Man_t * p, Amap_Obj_t * pNode )
{
    int nMaxCuts = p->pPars->nCutsMax;
    int * pBuffer;
    Amap_Cut_t * pNext, * pCut;
    int i, nWords, Entry, nCuts, nCuts2;
    assert( pNode->pData == NULL );
    // count memory needed
    nCuts = 1;
    nWords = 2;
    Vec_IntForEachEntry( p->vTemp, Entry, i )
    {
        for ( pCut = p->ppCutsTemp[Entry]; pCut; pCut = *Amap_ManCutNextP(pCut) )
        {
            nCuts++;
            if ( nCuts < nMaxCuts )
                nWords += pCut->nFans + 1;
        }
    }
    p->nBytesUsed += 4*nWords;
    // allocate memory
    pBuffer = (int *)Aig_MmFlexEntryFetch( p->pMemCuts, 4*nWords );
    pNext = (Amap_Cut_t *)pBuffer;
    // add the first cut
    pNext->iMat  = 0; 
    pNext->fInv  = 0;
    pNext->nFans = 1;
    pNext->Fans[0] = Abc_Var2Lit(pNode->Id, 0);
    pNext  = (Amap_Cut_t *)(pBuffer + 2);
    // add other cuts
    nCuts2 = 1;
    Vec_IntForEachEntry( p->vTemp, Entry, i )
    {
        for ( pCut = p->ppCutsTemp[Entry]; pCut; pCut = *Amap_ManCutNextP(pCut) )
        {
            nCuts2++;
            if ( nCuts2 < nMaxCuts )
            {
                memcpy( pNext, pCut, sizeof(int) * (pCut->nFans + 1) );
                pNext = (Amap_Cut_t *)((int *)pNext + pCut->nFans + 1);
            }
        }
        p->ppCutsTemp[Entry] = NULL;
    }
    assert( nCuts == nCuts2 );
    assert( (int *)pNext - pBuffer == nWords );
    // restore the storage
    Vec_IntClear( p->vTemp );
    Aig_MmFlexRestart( p->pMemTemp );
    for ( i = 0; i < 2*p->pLib->nNodes; i++ )
        if ( p->ppCutsTemp[i] != NULL )
            printf( "Amap_ManCutSaveStored(): Error!\n" );
    pNode->pData = (Amap_Cut_t *)pBuffer;
    pNode->nCuts = Abc_MinInt( nCuts, nMaxCuts-1 );
    assert( nCuts < (1<<20) );
//    printf("%d ", nCuts );
    // verify cuts
    pCut = NULL;
    Amap_NodeForEachCut( pNode, pNext, i )
//        for ( i = 0, pNext = (Amap_Cut_t *)pNode->pData; i < (int)pNode->nCuts; 
//        i++, pNext = Amap_ManCutNext(pNext) )
    {
        if ( i == nMaxCuts )
            break;
        assert( pCut == NULL || pCut->iMat <= pNext->iMat );
        pCut = pNext;
    }
}